

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::getUniqueID(Twine Path,UniqueID *Result)

{
  bool bVar1;
  error_code eVar2;
  UniqueID UVar3;
  uint64_t local_88;
  uint64_t local_80;
  undefined1 local_78 [8];
  error_code EC;
  file_status Status;
  UniqueID *Result_local;
  error_category *local_10;
  
  file_status::file_status((file_status *)&EC._M_cat);
  eVar2 = status(&Path,(file_status *)&EC._M_cat,true);
  EC._0_8_ = eVar2._M_cat;
  local_78._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_78);
  if (bVar1) {
    Result_local = (UniqueID *)(ulong)(uint)local_78._0_4_;
    local_10 = (error_category *)EC._0_8_;
  }
  else {
    UVar3 = file_status::getUniqueID((file_status *)&EC._M_cat);
    local_88 = UVar3.Device;
    Result->Device = local_88;
    local_80 = UVar3.File;
    Result->File = local_80;
    std::error_code::error_code((error_code *)&Result_local);
  }
  eVar2._0_8_ = (ulong)Result_local & 0xffffffff;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code getUniqueID(const Twine Path, UniqueID &Result) {
  file_status Status;
  std::error_code EC = status(Path, Status);
  if (EC)
    return EC;
  Result = Status.getUniqueID();
  return std::error_code();
}